

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

bool __thiscall tchecker::clockbounds::df_solver_t::solve(df_solver_t *this,local_lu_map_t *map)

{
  clock_id_t cVar1;
  bool bVar2;
  clock_id_t cVar3;
  loc_id_t lVar4;
  uint uVar5;
  no_storage_array_t<int> nVar6;
  map_t *pmVar7;
  invalid_argument *this_00;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  loc_id_t lVar11;
  
  cVar1 = this->_clock_number;
  cVar3 = local_lu_map_t::clock_number(map);
  if (cVar1 == cVar3) {
    lVar11 = this->_loc_number;
    lVar4 = local_lu_map_t::loc_number(map);
    if (lVar11 == lVar4) {
      bVar2 = ensure_tight(this);
      uVar5 = this->_loc_number;
      if (uVar5 != 0 && bVar2) {
        uVar9 = (ulong)this->_clock_number;
        lVar11 = 0;
        do {
          iVar8 = (int)uVar9;
          uVar9 = 0;
          if (iVar8 != 0) {
            uVar10 = 0;
            do {
              nVar6 = (no_storage_array_t<int>)L(this,lVar11,(clock_id_t)uVar10);
              pmVar7 = local_lu_map_t::L(map,lVar11);
              if ((pmVar7->super_array_capacity_t<unsigned_int>)._capacity <= uVar10) {
LAB_001a1f84:
                __assert_fail("i < BASE::_capacity",
                              "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                              ,0xf1,
                              "T &tchecker::make_array_t<int, 4, tchecker::array_capacity_t<unsigned int>>::operator[](typename BASE::capacity_t) [T = int, T_ALLOCSIZE = 4, BASE = tchecker::array_capacity_t<unsigned int>]"
                             );
              }
              (&pmVar7->_fam)[uVar10] = nVar6;
              nVar6 = (no_storage_array_t<int>)U(this,lVar11,(clock_id_t)uVar10);
              pmVar7 = local_lu_map_t::U(map,lVar11);
              if ((pmVar7->super_array_capacity_t<unsigned_int>)._capacity <= uVar10)
              goto LAB_001a1f84;
              (&pmVar7->_fam)[uVar10] = nVar6;
              uVar10 = uVar10 + 1;
              uVar9 = (ulong)this->_clock_number;
            } while (uVar10 < uVar9);
            uVar5 = this->_loc_number;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < uVar5);
      }
      return bVar2;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"*** solve: invalid number of locations");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"*** solve: invalid number of clocks");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool df_solver_t::solve(tchecker::clockbounds::local_lu_map_t & map)
{
  if (_clock_number != map.clock_number())
    throw std::invalid_argument("*** solve: invalid number of clocks");
  if (_loc_number != map.loc_number())
    throw std::invalid_argument("*** solve: invalid number of locations");

  bool consistent = ensure_tight();
  if (!consistent)
    return false;

  for (tchecker::loc_id_t loc = 0; loc < _loc_number; ++loc)
    for (tchecker::clock_id_t clock = 0; clock < _clock_number; ++clock) {
      map.L(loc)[clock] = L(loc, clock);
      map.U(loc)[clock] = U(loc, clock);
    }

  return true;
}